

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

void __thiscall irr::scene::CXMeshFileLoader::readUntilEndOfLine(CXMeshFileLoader *this)

{
  CXMeshFileLoader *this_local;
  
  if ((this->BinaryFormat & 1U) == 0) {
    while (*(c8 **)&(this->super_IMeshLoader).field_0x18 < this->End) {
      if ((**(char **)&(this->super_IMeshLoader).field_0x18 == '\n') ||
         (**(char **)&(this->super_IMeshLoader).field_0x18 == '\r')) {
        *(long *)&(this->super_IMeshLoader).field_0x18 =
             *(long *)&(this->super_IMeshLoader).field_0x18 + 1;
        this->Line = this->Line + 1;
        return;
      }
      *(long *)&(this->super_IMeshLoader).field_0x18 =
           *(long *)&(this->super_IMeshLoader).field_0x18 + 1;
    }
  }
  return;
}

Assistant:

void CXMeshFileLoader::readUntilEndOfLine()
{
	if (BinaryFormat)
		return;

	while (P < End) {
		if (P[0] == '\n' || P[0] == '\r') {
			++P;
			++Line;
			return;
		}

		++P;
	}
}